

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

void __thiscall
ear::StereoPannerDownmix::StereoPannerDownmix
          (StereoPannerDownmix *this,VectorXi *outputChannels,MatrixXd *positions)

{
  shared_ptr<ear::PointSourcePanner> local_170;
  allocator<char> local_159;
  string local_158;
  Layout local_138;
  undefined1 local_c8 [8];
  Layout layout;
  Matrix<double,__1,__1,_0,__1,__1> local_48;
  Matrix<int,__1,_1,_0,__1,_1> local_30;
  MatrixXd *local_20;
  MatrixXd *positions_local;
  VectorXi *outputChannels_local;
  StereoPannerDownmix *this_local;
  
  local_20 = positions;
  positions_local = (MatrixXd *)outputChannels;
  outputChannels_local = (VectorXi *)this;
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix(&local_30,outputChannels);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&local_48,positions);
  RegionHandler::RegionHandler(&this->super_RegionHandler,&local_30,&local_48);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_48);
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(&local_30);
  (this->super_RegionHandler)._vptr_RegionHandler = (_func_int **)&PTR_handle_00314810;
  std::shared_ptr<ear::PointSourcePanner>::shared_ptr(&this->_psp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"0+5+0",&local_159);
  getLayout(&local_138,&local_158);
  Layout::withoutLfe((Layout *)local_c8,&local_138);
  Layout::~Layout(&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  configureFullPolarPanner((ear *)&local_170,(Layout *)local_c8);
  std::shared_ptr<ear::PointSourcePanner>::operator=(&this->_psp,&local_170);
  std::shared_ptr<ear::PointSourcePanner>::~shared_ptr(&local_170);
  Layout::~Layout((Layout *)local_c8);
  return;
}

Assistant:

StereoPannerDownmix::StereoPannerDownmix(Eigen::VectorXi outputChannels,
                                           Eigen::MatrixXd positions)
      : RegionHandler(outputChannels, positions) {
    auto layout = getLayout("0+5+0").withoutLfe();
    _psp = configureFullPolarPanner(layout);
  }